

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oarchive_std_suite.cpp
# Opt level: O0

void map_suite::test_int_string_two(void)

{
  mapped_type *pmVar1;
  iterator iVar2;
  iterator iVar3;
  undefined7 uStack_110;
  undefined1 uStack_109;
  output_type expected [11];
  key_type local_fc;
  undefined1 local_f8 [8];
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  value;
  undefined1 local_b8 [8];
  oarchive ar;
  undefined1 local_20 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  trial::protocol::bintoken::oarchive::
  oarchive<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((oarchive *)local_b8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20)
  ;
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_f8);
  local_fc = 0x11;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_f8,&stack0xffffffffffffff04);
  std::__cxx11::string::operator=((string *)pmVar1,"A");
  stack0xffffffffffffff00 = 0x12;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_f8,(key_type *)(expected + 8));
  std::__cxx11::string::operator=((string *)pmVar1,"B");
  boost::archive::detail::interface_oarchive<trial::protocol::bintoken::oarchive>::operator<<
            ((interface_oarchive<trial::protocol::bintoken::oarchive> *)local_b8,
             (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_f8);
  uStack_110 = 0x124101a911829e;
  _uStack_109 = 0x9f4201a9;
  iVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  iVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  boost::detail::
  test_all_with_impl<std::ostream,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/oarchive_std_suite.cpp"
             ,0x319,"void map_suite::test_int_string_two()",iVar2._M_current,iVar3._M_current,
             &uStack_110,expected + 3);
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_f8);
  trial::protocol::bintoken::oarchive::~oarchive((oarchive *)local_b8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  return;
}

Assistant:

void test_int_string_two()
{
    std::vector<output_type> result;
    format::oarchive ar(result);
    std::map<int, std::string> value;
    value[0x11] = "A";
    value[0x12] = "B";
    ar << value;

    output_type expected[] = { token::code::begin_assoc_array,
                              token::code::null,
                              0x11,
                              token::code::string8, 0x01, 0x41,
                              0x12,
                              token::code::string8, 0x01, 0x42,
                              token::code::end_assoc_array };
    TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                 expected, expected + sizeof(expected),
                                 std::equal_to<output_type>());
}